

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# alex_nodes.h
# Opt level: O0

int __thiscall
alex::AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>::
lower_bound<int>(AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
                 *this,int *key)

{
  int iVar1;
  AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true> *in_RSI;
  long in_RDI;
  int *in_stack_00000008;
  int position;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 in_stack_ffffffffffffffec;
  
  *(int *)(in_RDI + 0x98) = *(int *)(in_RDI + 0x98) + 1;
  predict_position(in_RSI,(int *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  iVar1 = exponential_search_lower_bound<int>
                    ((AlexDataNode<int,_int,_alex::AlexCompare,_std::allocator<std::pair<int,_int>_>,_true>
                      *)key,position,in_stack_00000008);
  return iVar1;
}

Assistant:

int lower_bound(const K& key) {
    num_lookups_++;
    int position = predict_position(key);
    return exponential_search_lower_bound(position, key);
  }